

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestParser.cpp
# Opt level: O1

void __thiscall UnitTest_parser_exp1::Run(UnitTest_parser_exp1 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  long lVar3;
  long lVar4;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> root;
  string local_40;
  long *local_20;
  
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"a = 1 + 2 + 3","");
  io::text::InStringStream::SetInputString
            ((InStringStream *)(anonymous_namespace)::g_parser,&local_40);
  luna::Parse((luna *)&local_20,(Lexer *)((anonymous_namespace)::g_parser + 0xd0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)&PTR__Visitor_001871a8;
  local_40._M_string_length = 0;
  (**(code **)(*local_20 + 0x10))(local_20,&local_40,0);
  sVar2 = local_40._M_string_length;
  if (*(long *)(local_40._M_string_length + 0x10) - *(long *)(local_40._M_string_length + 8) != 8) {
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"\'exp_list->exp_list_.size() == 1\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  if (**(long **)(sVar2 + 8) == 0) {
    lVar3 = 0;
  }
  else {
    lVar3 = __dynamic_cast(**(long **)(sVar2 + 8),&luna::SyntaxTree::typeinfo,
                           &luna::BinaryExpression::typeinfo,0);
  }
  if (lVar3 == 0) {
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"\'bin_exp\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  if (*(int *)(lVar3 + 0x30) != 0x2b) {
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"\'bin_exp->op_token_.token_ == \'+\'\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  if (*(long *)(lVar3 + 0x10) == 0) {
LAB_00138928:
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"\'dynamic_cast<luna::Terminator *>(bin_exp->right_.get())\'","")
    ;
    UnitTestBase::Error(&this->super_UnitTestBase,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  else {
    lVar4 = __dynamic_cast(*(long *)(lVar3 + 0x10),&luna::SyntaxTree::typeinfo,
                           &luna::Terminator::typeinfo,0);
    if (lVar4 == 0) goto LAB_00138928;
  }
  if (*(long *)(lVar3 + 8) == 0) {
    lVar3 = 0;
  }
  else {
    lVar3 = __dynamic_cast(*(long *)(lVar3 + 8),&luna::SyntaxTree::typeinfo,
                           &luna::BinaryExpression::typeinfo,0);
  }
  if (lVar3 == 0) {
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"\'bin_exp\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  if (*(int *)(lVar3 + 0x30) != 0x2b) {
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"\'bin_exp->op_token_.token_ == \'+\'\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  if (*(long *)(lVar3 + 8) == 0) {
LAB_00138a22:
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"\'dynamic_cast<luna::Terminator *>(bin_exp->left_.get())\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  else {
    lVar4 = __dynamic_cast(*(long *)(lVar3 + 8),&luna::SyntaxTree::typeinfo,
                           &luna::Terminator::typeinfo,0);
    if (lVar4 == 0) goto LAB_00138a22;
  }
  if (*(long *)(lVar3 + 0x10) != 0) {
    lVar3 = __dynamic_cast(*(long *)(lVar3 + 0x10),&luna::SyntaxTree::typeinfo,
                           &luna::Terminator::typeinfo,0);
    if (lVar3 != 0) goto LAB_00138ab3;
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"\'dynamic_cast<luna::Terminator *>(bin_exp->right_.get())\'","");
  UnitTestBase::Error(&this->super_UnitTestBase,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
LAB_00138ab3:
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 8))();
  }
  return;
}

Assistant:

TEST_CASE(parser_exp1)
{
    auto root = Parse("a = 1 + 2 + 3");
    auto exp_list = ASTFind<luna::ExpressionList>(root, AcceptAST());
    EXPECT_TRUE(exp_list->exp_list_.size() == 1);
    auto &exp = exp_list->exp_list_[0];
    auto bin_exp = dynamic_cast<luna::BinaryExpression *>(exp.get());
    EXPECT_TRUE(bin_exp);
    EXPECT_TRUE(bin_exp->op_token_.token_ == '+');
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(bin_exp->right_.get()));

    // 1 + 2
    bin_exp = dynamic_cast<luna::BinaryExpression *>(bin_exp->left_.get());
    EXPECT_TRUE(bin_exp);
    EXPECT_TRUE(bin_exp->op_token_.token_ == '+');
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(bin_exp->left_.get()));
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(bin_exp->right_.get()));
}